

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  CppType CVar4;
  uint uVar5;
  uint32 uVar6;
  Type TVar7;
  protobuf *ppVar8;
  char *__s;
  string *psVar9;
  EnumDescriptor *this_00;
  EnumValueDescriptor *this_01;
  Descriptor *this_02;
  LogMessage *other;
  int i;
  int i_00;
  long i_01;
  long i_02;
  EnumDescriptor *descriptor;
  Descriptor *descriptor_00;
  float fVar10;
  float fVar11;
  double dVar12;
  double dVar13;
  SubstituteArg *in_stack_fffffffffffff958;
  allocator<char> local_5aa;
  LogFinisher local_5a9;
  LogMessage local_5a8;
  string local_570;
  string local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  SubstituteArg local_510;
  SubstituteArg local_4e0;
  SubstituteArg local_4b0;
  SubstituteArg local_480;
  SubstituteArg local_450;
  SubstituteArg local_420;
  SubstituteArg local_3f0;
  SubstituteArg local_3c0;
  SubstituteArg local_390;
  string local_360;
  SubstituteArg local_340;
  string local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  allocator<char> local_2c9;
  SubstituteArg local_2c8;
  SubstituteArg local_298;
  SubstituteArg local_268;
  SubstituteArg local_238;
  SubstituteArg local_208;
  SubstituteArg local_1d8;
  SubstituteArg local_1a8;
  SubstituteArg local_178;
  SubstituteArg local_148;
  string local_118;
  SubstituteArg local_f8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_9f;
  allocator<char> local_9e;
  allocator<char> local_9d;
  float local_9c;
  undefined1 local_98 [4];
  float value_1;
  allocator<char> local_73;
  allocator<char> local_72;
  allocator<char> local_71;
  double local_70;
  double value;
  string local_38;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  
  local_18 = (FieldDescriptor *)this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  switch(CVar4) {
  case CPPTYPE_INT32:
    uVar5 = FieldDescriptor::default_value_int32(local_18);
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)uVar5,i);
    break;
  case CPPTYPE_INT64:
    ppVar8 = (protobuf *)FieldDescriptor::default_value_int64(local_18);
    SimpleItoa_abi_cxx11_(&local_38,ppVar8,i_01);
    std::operator+(__return_storage_ptr__,&local_38,"L");
    std::__cxx11::string::~string((string *)&local_38);
    break;
  case CPPTYPE_UINT32:
    uVar6 = FieldDescriptor::default_value_uint32(local_18);
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)uVar6,i_00);
    break;
  case CPPTYPE_UINT64:
    ppVar8 = (protobuf *)FieldDescriptor::default_value_uint64(local_18);
    SimpleItoa_abi_cxx11_((string *)&value,ppVar8,i_02);
    std::operator+(__return_storage_ptr__,(string *)&value,"L");
    std::__cxx11::string::~string((string *)&value);
    break;
  case CPPTYPE_DOUBLE:
    dVar12 = FieldDescriptor::default_value_double(local_18);
    local_70 = dVar12;
    dVar13 = std::numeric_limits<double>::infinity();
    dVar2 = local_70;
    if ((dVar12 != dVar13) || (NAN(dVar12) || NAN(dVar13))) {
      dVar12 = std::numeric_limits<double>::infinity();
      if ((dVar2 != -dVar12) || (NAN(dVar2) || NAN(-dVar12))) {
        if (NAN(local_70)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"Double.NaN",&local_73);
          std::allocator<char>::~allocator(&local_73);
        }
        else {
          SimpleDtoa_abi_cxx11_((string *)local_98,(protobuf *)this,local_70);
          std::operator+(__return_storage_ptr__,(string *)local_98,"D");
          std::__cxx11::string::~string((string *)local_98);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"Double.NEGATIVE_INFINITY",&local_72);
        std::allocator<char>::~allocator(&local_72);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"Double.POSITIVE_INFINITY",&local_71);
      std::allocator<char>::~allocator(&local_71);
    }
    break;
  case CPPTYPE_FLOAT:
    fVar10 = FieldDescriptor::default_value_float(local_18);
    local_9c = fVar10;
    fVar11 = std::numeric_limits<float>::infinity();
    fVar1 = local_9c;
    if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
      fVar10 = std::numeric_limits<float>::infinity();
      if ((fVar1 != -fVar10) || (NAN(fVar1) || NAN(-fVar10))) {
        if (NAN(local_9c)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"Float.NaN",&local_9f);
          std::allocator<char>::~allocator(&local_9f);
        }
        else {
          SimpleFtoa_abi_cxx11_(&local_c0,(protobuf *)this,local_9c);
          std::operator+(__return_storage_ptr__,&local_c0,"F");
          std::__cxx11::string::~string((string *)&local_c0);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"Float.NEGATIVE_INFINITY",&local_9e);
        std::allocator<char>::~allocator(&local_9e);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"Float.POSITIVE_INFINITY",&local_9d);
      std::allocator<char>::~allocator(&local_9d);
    }
    break;
  case CPPTYPE_BOOL:
    bVar3 = FieldDescriptor::default_value_bool(local_18);
    __s = "false";
    if (bVar3) {
      __s = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_c1);
    std::allocator<char>::~allocator(&local_c1);
    break;
  case CPPTYPE_ENUM:
    this_00 = FieldDescriptor::enum_type(local_18);
    ClassName_abi_cxx11_(&local_550,(java *)this_00,descriptor);
    std::operator+(&local_530,&local_550,".");
    this_01 = FieldDescriptor::default_value_enum(local_18);
    psVar9 = EnumValueDescriptor::name_abi_cxx11_(this_01);
    std::operator+(__return_storage_ptr__,&local_530,psVar9);
    std::__cxx11::string::~string((string *)&local_530);
    std::__cxx11::string::~string((string *)&local_550);
    break;
  case CPPTYPE_STRING:
    TVar7 = GetType(local_18);
    if (TVar7 == TYPE_BYTES) {
      bVar3 = FieldDescriptor::has_default_value(local_18);
      if (bVar3) {
        psVar9 = FieldDescriptor::default_value_string_abi_cxx11_(local_18);
        CEscape(&local_118,psVar9);
        strings::internal::SubstituteArg::SubstituteArg(&local_f8,&local_118);
        strings::internal::SubstituteArg::SubstituteArg(&local_148);
        strings::internal::SubstituteArg::SubstituteArg(&local_178);
        strings::internal::SubstituteArg::SubstituteArg(&local_1a8);
        strings::internal::SubstituteArg::SubstituteArg(&local_1d8);
        strings::internal::SubstituteArg::SubstituteArg(&local_208);
        strings::internal::SubstituteArg::SubstituteArg(&local_238);
        strings::internal::SubstituteArg::SubstituteArg(&local_268);
        strings::internal::SubstituteArg::SubstituteArg(&local_298);
        strings::internal::SubstituteArg::SubstituteArg(&local_2c8);
        strings::Substitute_abi_cxx11_
                  (__return_storage_ptr__,
                   (strings *)"com.google.protobuf.Internal.bytesDefaultValue(\"$0\")",
                   (char *)&local_f8,&local_148,&local_178,&local_1a8,&local_1d8,&local_208,
                   &local_238,&local_268,&local_298,&local_2c8,in_stack_fffffffffffff958);
        std::__cxx11::string::~string((string *)&local_118);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"com.google.protobuf.ByteString.EMPTY",
                   &local_2c9);
        std::allocator<char>::~allocator(&local_2c9);
      }
    }
    else {
      psVar9 = FieldDescriptor::default_value_string_abi_cxx11_(local_18);
      bVar3 = AllAscii(psVar9);
      if (bVar3) {
        psVar9 = FieldDescriptor::default_value_string_abi_cxx11_(local_18);
        CEscape(&local_310,psVar9);
        std::operator+(&local_2f0,"\"",&local_310);
        std::operator+(__return_storage_ptr__,&local_2f0,"\"");
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_310);
      }
      else {
        psVar9 = FieldDescriptor::default_value_string_abi_cxx11_(local_18);
        CEscape(&local_360,psVar9);
        strings::internal::SubstituteArg::SubstituteArg(&local_340,&local_360);
        strings::internal::SubstituteArg::SubstituteArg(&local_390);
        strings::internal::SubstituteArg::SubstituteArg(&local_3c0);
        strings::internal::SubstituteArg::SubstituteArg(&local_3f0);
        strings::internal::SubstituteArg::SubstituteArg(&local_420);
        strings::internal::SubstituteArg::SubstituteArg(&local_450);
        strings::internal::SubstituteArg::SubstituteArg(&local_480);
        strings::internal::SubstituteArg::SubstituteArg(&local_4b0);
        strings::internal::SubstituteArg::SubstituteArg(&local_4e0);
        strings::internal::SubstituteArg::SubstituteArg(&local_510);
        strings::Substitute_abi_cxx11_
                  (__return_storage_ptr__,
                   (strings *)"com.google.protobuf.Internal.stringDefaultValue(\"$0\")",
                   (char *)&local_340,&local_390,&local_3c0,&local_3f0,&local_420,&local_450,
                   &local_480,&local_4b0,&local_4e0,&local_510,in_stack_fffffffffffff958);
        std::__cxx11::string::~string((string *)&local_360);
      }
    }
    break;
  case CPPTYPE_MESSAGE:
    this_02 = FieldDescriptor::message_type(local_18);
    ClassName_abi_cxx11_(&local_570,(java *)this_02,descriptor_00);
    std::operator+(__return_storage_ptr__,&local_570,".getDefaultInstance()");
    std::__cxx11::string::~string((string *)&local_570);
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_5a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x165);
    other = internal::LogMessage::operator<<(&local_5a8,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_5a9,other);
    internal::LogMessage::~LogMessage(&local_5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_5aa);
    std::allocator<char>::~allocator(&local_5aa);
  }
  return __return_storage_ptr__;
}

Assistant:

string DefaultValue(const FieldDescriptor* field) {
  // Switch on CppType since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return SimpleItoa(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      // Need to print as a signed int since Java has no unsigned.
      return SimpleItoa(static_cast<int32>(field->default_value_uint32()));
    case FieldDescriptor::CPPTYPE_INT64:
      return SimpleItoa(field->default_value_int64()) + "L";
    case FieldDescriptor::CPPTYPE_UINT64:
      return SimpleItoa(static_cast<int64>(field->default_value_uint64())) +
             "L";
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == numeric_limits<double>::infinity()) {
        return "Double.POSITIVE_INFINITY";
      } else if (value == -numeric_limits<double>::infinity()) {
        return "Double.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Double.NaN";
      } else {
        return SimpleDtoa(value) + "D";
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value = field->default_value_float();
      if (value == numeric_limits<float>::infinity()) {
        return "Float.POSITIVE_INFINITY";
      } else if (value == -numeric_limits<float>::infinity()) {
        return "Float.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Float.NaN";
      } else {
        return SimpleFtoa(value) + "F";
      }
    }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_STRING:
      if (GetType(field) == FieldDescriptor::TYPE_BYTES) {
        if (field->has_default_value()) {
          // See comments in Internal.java for gory details.
          return strings::Substitute(
            "com.google.protobuf.Internal.bytesDefaultValue(\"$0\")",
            CEscape(field->default_value_string()));
        } else {
          return "com.google.protobuf.ByteString.EMPTY";
        }
      } else {
        if (AllAscii(field->default_value_string())) {
          // All chars are ASCII.  In this case CEscape() works fine.
          return "\"" + CEscape(field->default_value_string()) + "\"";
        } else {
          // See comments in Internal.java for gory details.
          return strings::Substitute(
              "com.google.protobuf.Internal.stringDefaultValue(\"$0\")",
              CEscape(field->default_value_string()));
        }
      }

    case FieldDescriptor::CPPTYPE_ENUM:
      return ClassName(field->enum_type()) + "." +
          field->default_value_enum()->name();

    case FieldDescriptor::CPPTYPE_MESSAGE:
      return ClassName(field->message_type()) + ".getDefaultInstance()";

    // No default because we want the compiler to complain if any new
    // types are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}